

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_queue.c
# Opt level: O1

OPTIONHANDLER_HANDLE message_queue_retrieve_options(MESSAGE_QUEUE_HANDLE message_queue)

{
  OPTIONHANDLER_RESULT OVar1;
  OPTIONHANDLER_HANDLE handle;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  
  if (message_queue == (MESSAGE_QUEUE_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (OPTIONHANDLER_HANDLE)0x0;
    }
    pcVar4 = "invalid argument (message_queue is NULL)";
    iVar3 = 0x2b3;
LAB_00141617:
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/message_queue.c"
              ,"message_queue_retrieve_options",iVar3,1,pcVar4);
    return (OPTIONHANDLER_HANDLE)0x0;
  }
  handle = OptionHandler_Create(cloneOption,destroyOption,setOption);
  if (handle == (OPTIONHANDLER_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (OPTIONHANDLER_HANDLE)0x0;
    }
    pcVar4 = "failed creating OPTIONHANDLER_HANDLE";
    iVar3 = 0x2b8;
    goto LAB_00141617;
  }
  OVar1 = OptionHandler_AddOption
                    (handle,"SAVED_OPTION_MAX_ENQUEUE_TIME_SECS",
                     &message_queue->max_message_enqueued_time_secs);
  if (OVar1 == OPTIONHANDLER_OK) {
    OVar1 = OptionHandler_AddOption
                      (handle,"SAVED_OPTION_MAX_PROCESSING_TIME_SECS",
                       &message_queue->max_message_processing_time_secs);
    if (OVar1 == OPTIONHANDLER_OK) {
      OVar1 = OptionHandler_AddOption
                        (handle,"SAVED_OPTION_MAX_RETRY_COUNT",&message_queue->max_retry_count);
      if (OVar1 == OPTIONHANDLER_OK) {
        return handle;
      }
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_001416c2;
      pcVar4 = "SAVED_OPTION_MAX_PROCESSING_TIME_SECS";
      iVar3 = 0x2c8;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_001416c2;
      pcVar4 = "SAVED_OPTION_MAX_PROCESSING_TIME_SECS";
      iVar3 = 0x2c2;
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_001416c2;
    pcVar4 = "SAVED_OPTION_MAX_ENQUEUE_TIME_SECS";
    iVar3 = 700;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/message_queue.c"
            ,"message_queue_retrieve_options",iVar3,1,"failed retrieving options (failed adding %s)"
            ,pcVar4);
LAB_001416c2:
  OptionHandler_Destroy(handle);
  return (OPTIONHANDLER_HANDLE)0x0;
}

Assistant:

OPTIONHANDLER_HANDLE message_queue_retrieve_options(MESSAGE_QUEUE_HANDLE message_queue)
{
    OPTIONHANDLER_HANDLE result;

    if (message_queue == NULL)
    {
        LogError("invalid argument (message_queue is NULL)");
        result = NULL;
    }
    else if ((result = OptionHandler_Create(cloneOption, destroyOption, setOption)) == NULL)
    {
        LogError("failed creating OPTIONHANDLER_HANDLE");
    }
    else if (OptionHandler_AddOption(result, SAVED_OPTION_MAX_ENQUEUE_TIME_SECS, &message_queue->max_message_enqueued_time_secs) != OPTIONHANDLER_OK)
    {
        LogError("failed retrieving options (failed adding %s)", SAVED_OPTION_MAX_ENQUEUE_TIME_SECS);
        OptionHandler_Destroy(result);
        result = NULL;
    }
    else if (OptionHandler_AddOption(result, SAVED_OPTION_MAX_PROCESSING_TIME_SECS, &message_queue->max_message_processing_time_secs) != OPTIONHANDLER_OK)
    {
        LogError("failed retrieving options (failed adding %s)", SAVED_OPTION_MAX_PROCESSING_TIME_SECS);
        OptionHandler_Destroy(result);
        result = NULL;
    }
    else if (OptionHandler_AddOption(result, SAVED_OPTION_MAX_RETRY_COUNT, &message_queue->max_retry_count) != OPTIONHANDLER_OK)
    {
        LogError("failed retrieving options (failed adding %s)", SAVED_OPTION_MAX_PROCESSING_TIME_SECS);
        OptionHandler_Destroy(result);
        result = NULL;
    }

    return result;
}